

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_composite_with_ulong_descriptor(uint64_t descriptor)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE value;
  AMQP_VALUE pAVar2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE descriptor_ulong_value;
  LOGGER_LOG l;
  AMQP_VALUE_DATA *result;
  uint64_t descriptor_local;
  
  l = (LOGGER_LOG)REFCOUNT_AMQP_VALUE_DATA_Create();
  if ((AMQP_VALUE_DATA *)l == (AMQP_VALUE_DATA *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_composite_with_ulong_descriptor",0x1c67,1,
                "Cannot allocate memory for composite type");
    }
  }
  else {
    value = amqpvalue_create_ulong(descriptor);
    if (value == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_create_composite_with_ulong_descriptor",0x1c6e,1,
                  "Cannot create ulong descriptor for composite type");
      }
      REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      ((AMQP_VALUE_DATA *)l)->type = AMQP_TYPE_COMPOSITE;
      (((AMQP_VALUE_DATA *)l)->value).described_value.descriptor = value;
      pAVar2 = amqpvalue_create_list();
      (((AMQP_VALUE_DATA *)l)->value).described_value.value = pAVar2;
      if ((((AMQP_VALUE_DATA *)l)->value).described_value.value == (AMQP_VALUE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                    ,"amqpvalue_create_composite_with_ulong_descriptor",0x1c79,1,
                    "Cannot create list for composite type");
        }
        amqpvalue_destroy(value);
        REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_create_composite_with_ulong_descriptor(uint64_t descriptor)
{
    AMQP_VALUE_DATA* result = (AMQP_VALUE_DATA*)REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        LogError("Cannot allocate memory for composite type");
    }
    else
    {
        AMQP_VALUE descriptor_ulong_value = amqpvalue_create_ulong(descriptor);
        if (descriptor_ulong_value == NULL)
        {
            LogError("Cannot create ulong descriptor for composite type");
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
            result = NULL;
        }
        else
        {
            result->type = AMQP_TYPE_COMPOSITE;
            result->value.described_value.descriptor = descriptor_ulong_value;
            result->value.described_value.value = amqpvalue_create_list();
            if (result->value.described_value.value == NULL)
            {
                LogError("Cannot create list for composite type");
                amqpvalue_destroy(descriptor_ulong_value);
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
        }
    }

    return result;
}